

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

shared_ptr<aeron::Subscription> __thiscall
aeron::archive::AeronArchive::replay
          (AeronArchive *this,int64_t recordingId,int64_t position,int64_t length,
          string *replayChannel,int32_t replayStreamId)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_0000008c;
  shared_ptr<aeron::Subscription> sVar1;
  undefined4 in_stack_00000008;
  undefined4 in_stack_ffffffffffffff0c;
  function<void_(aeron::Image_&)> local_80;
  on_unavailable_image_t local_60;
  undefined8 local_40;
  string *replayChannel_local;
  int64_t length_local;
  int64_t position_local;
  int64_t recordingId_local;
  AeronArchive *this_local;
  
  local_40 = CONCAT44(in_register_0000008c,replayStreamId);
  replayChannel_local = replayChannel;
  length_local = length;
  position_local = position;
  recordingId_local = recordingId;
  this_local = this;
  std::function<void(aeron::Image&)>::function<void(&)(aeron::Image&),void>
            ((function<void(aeron::Image&)> *)&local_60,defaultOnAvailableImageHandler);
  std::function<void(aeron::Image&)>::function<void(&)(aeron::Image&),void>
            ((function<void(aeron::Image&)> *)&local_80,defaultOnUnavailableImageHandler);
  replay(this,recordingId,position,length,replayChannel,replayStreamId,
         (on_available_image_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_00000008),&local_60);
  std::function<void_(aeron::Image_&)>::~function(&local_80);
  std::function<void_(aeron::Image_&)>::~function(&local_60);
  sVar1.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<aeron::Subscription>)
         sVar1.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<aeron::Subscription> AeronArchive::replay(std::int64_t recordingId, std::int64_t position,
                                                          std::int64_t length, const std::string& replayChannel,
                                                          std::int32_t replayStreamId) {
    return replay(recordingId, position, length, replayChannel, replayStreamId, defaultOnAvailableImageHandler,
                  defaultOnUnavailableImageHandler);
}